

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

Var Js::JavascriptNumber::ToVarIntCheck(double value,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  int nValue_00;
  JavascriptLibrary *this;
  Var pvVar3;
  double dblCheck;
  int nValue;
  ScriptContext *scriptContext_local;
  double value_local;
  
  if ((value != 0.0) || (NAN(value))) {
    if ((value != 1.0) || (NAN(value))) {
      nValue_00 = (int)value;
      if ((((double)nValue_00 == value) && (!NAN((double)nValue_00) && !NAN(value))) &&
         (bVar1 = TaggedInt::IsOverflow(nValue_00), !bVar1)) {
        pvVar3 = TaggedInt::ToVarUnchecked(nValue_00);
        return pvVar3;
      }
      value_local = (double)NewInlined(value,scriptContext);
    }
    else {
      value_local = (double)TaggedInt::ToVarUnchecked(1);
    }
  }
  else {
    BVar2 = IsNegZero(value);
    if (BVar2 == 0) {
      value_local = (double)TaggedInt::ToVarUnchecked(0);
    }
    else {
      this = ScriptContext::GetLibrary(scriptContext);
      value_local = (double)JavascriptLibraryBase::GetNegativeZero
                                      (&this->super_JavascriptLibraryBase);
    }
  }
  return (Var)value_local;
}

Assistant:

Var JavascriptNumber::ToVarIntCheck(double value,ScriptContext* scriptContext)
    {
        //
        // Check if a well-known value:
        // - This significantly cuts down on the below floating-point to integer conversions.
        //

        if (value == 0.0)
        {
            if(IsNegZero(value))
            {
                return scriptContext->GetLibrary()->GetNegativeZero();
            }
            return TaggedInt::ToVarUnchecked(0);
        }
        if (value == 1.0)
        {
            return TaggedInt::ToVarUnchecked(1);
        }

        //
        // Check if number can be reduced back into a TaggedInt:
        // - This avoids extra GC.
        //

        int nValue      = (int) value;
        double dblCheck = (double) nValue;
        if ((dblCheck == value) && (!TaggedInt::IsOverflow(nValue)))
        {
            return TaggedInt::ToVarUnchecked(nValue);
        }

        return JavascriptNumber::NewInlined(value,scriptContext);
    }